

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# internal_dwa_simd.h
# Opt level: O0

void dctInverse8x8_sse2_6(float *data)

{
  int in_stack_000002f4;
  float *in_stack_000002f8;
  
  dctInverse8x8_sse2(in_stack_000002f8,in_stack_000002f4);
  return;
}

Assistant:

static void
dctInverse8x8_sse2_6 (float* data)
{
    dctInverse8x8_sse2 (data, 6);
}